

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

string * __thiscall
smf::Options::getCommand_abi_cxx11_(string *__return_storage_ptr__,Options *this)

{
  size_type sVar1;
  reference pvVar2;
  allocator local_19;
  Options *local_18;
  Options *this_local;
  
  local_18 = this;
  this_local = (Options *)__return_storage_ptr__;
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->m_argument);
  if (sVar1 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->m_argument,0);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pvVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Options::getCommand(void) {
	if (m_argument.size() == 0) {
		return "";
	} else {
		return m_argument[0];
	}
}